

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorRings(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  Pring **p;
  Pring **p_00;
  int *piVar1;
  int *piVar2;
  Pring *pPVar3;
  Pring *pPVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  Pring *pPVar8;
  Pring *pPVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  piVar1 = (this->row).perm;
  piVar2 = (this->col).perm;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (&(this->temp).pivot_col,this->thedim + 1);
  p = &(this->temp).pivot_colNZ;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (p,this->thedim + 1);
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (&(this->temp).pivot_row,this->thedim + 1);
  p_00 = &(this->temp).pivot_rowNZ;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (p_00,this->thedim + 1);
  uVar5 = this->thedim - (this->temp).stage;
  if (-1 < (int)uVar5) {
    iVar6 = uVar5 + 1;
    pPVar9 = *p_00 + uVar5;
    pPVar8 = *p + uVar5;
    do {
      pPVar8->next = pPVar8;
      pPVar8->prev = pPVar8;
      pPVar9->next = pPVar9;
      pPVar9->prev = pPVar9;
      iVar6 = iVar6 + -1;
      pPVar9 = pPVar9 + -1;
      pPVar8 = pPVar8 + -1;
    } while (0 < iVar6);
  }
  if (0 < this->thedim) {
    lVar12 = 0;
    lVar13 = 0;
    lVar10 = 0;
    lVar11 = 0;
    do {
      if (*(int *)((long)piVar1 + lVar10) < 0) {
        lVar7 = (long)*(int *)((long)(this->u).row.len + lVar10);
        if (lVar7 < 1) goto LAB_0027e5ef;
        pPVar9 = (this->temp).pivot_row;
        pPVar3 = (this->temp).pivot_rowNZ;
        pPVar4 = pPVar3[lVar7].next;
        pPVar8 = (Pring *)((long)&pPVar9->next + lVar13);
        (&pPVar9->next)[lVar10] = pPVar4;
        pPVar4->prev = pPVar8;
        (&pPVar9->prev)[lVar10] = pPVar3 + lVar7;
        pPVar3[lVar7].next = pPVar8;
        (&pPVar9->idx)[lVar10 * 2] = (int)lVar11;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)(((this->temp).s_max.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar12),-1);
      }
      if (*(int *)((long)piVar2 + lVar10) < 0) {
        lVar7 = (long)*(int *)((long)(this->temp).s_cact + lVar10);
        if (lVar7 < 1) {
LAB_0027e5ef:
          this->stat = SINGULAR;
          return;
        }
        pPVar9 = (this->temp).pivot_col;
        pPVar3 = (this->temp).pivot_colNZ;
        pPVar4 = pPVar3[lVar7].next;
        pPVar8 = (Pring *)((long)&pPVar9->next + lVar13);
        (&pPVar9->next)[lVar10] = pPVar4;
        pPVar4->prev = pPVar8;
        (&pPVar9->prev)[lVar10] = pPVar3 + lVar7;
        pPVar3[lVar7].next = pPVar8;
        (&pPVar9->idx)[lVar10 * 2] = (int)lVar11;
        *(undefined4 *)((long)(this->temp).s_mark + lVar10) = 0;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 4;
      lVar13 = lVar13 + 0x20;
      lVar12 = lVar12 + 0x38;
    } while (lVar11 < this->thedim);
  }
  return;
}

Assistant:

void CLUFactor<R>::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactor<R>::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}